

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxharrisrt.h
# Opt level: O2

int __thiscall
soplex::
SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::clone(SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  
  this_00 = (SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)operator_new(0xb0);
  SPxHarrisRT(this_00,this);
  return (int)this_00;
}

Assistant:

inline virtual SPxRatioTester<R>* clone() const
   {
      return new SPxHarrisRT(*this);
   }